

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_msg_header_trim_u64(nng_msg *msg,uint64_t *val)

{
  byte *pbVar1;
  size_t sVar2;
  uint64_t v;
  uint8_t *header;
  uint64_t *val_local;
  nng_msg *msg_local;
  
  pbVar1 = (byte *)nni_msg_header(msg);
  sVar2 = nng_msg_header_len(msg);
  if (sVar2 < 8) {
    msg_local._4_4_ = 3;
  }
  else {
    *val = ((ulong)*pbVar1 << 0x38) + ((ulong)pbVar1[1] << 0x30) + ((ulong)pbVar1[2] << 0x28) +
           ((ulong)pbVar1[3] << 0x20) + (ulong)pbVar1[4] * 0x1000000 + (ulong)pbVar1[5] * 0x10000 +
           (ulong)pbVar1[6] * 0x100 + (ulong)pbVar1[7];
    nni_msg_header_trim(msg,8);
    msg_local._4_4_ = 0;
  }
  return msg_local._4_4_;
}

Assistant:

int
nng_msg_header_trim_u64(nng_msg *msg, uint64_t *val)
{
	uint8_t *header = nni_msg_header(msg);
	uint64_t v;
	if (nng_msg_header_len(msg) < sizeof(v)) {
		return (NNG_EINVAL);
	}
	NNI_GET64(header, v);
	*val = v;
	nni_msg_header_trim(msg, sizeof(v));
	return (0);
}